

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Ptr_t * Abc_NtkNodeSupport(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  Vec_Ptr_t *vNodes;
  ulong uVar1;
  Abc_Obj_t *pNode;
  ulong uVar2;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes = Vec_PtrAlloc(100);
  uVar2 = 0;
  uVar1 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    pNode = ppNodes[uVar2];
    if (0xfffffffd < (*(uint *)&pNode->field_0x14 & 0xf) - 5) {
      pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
    }
    Abc_NtkNodeSupport_rec(pNode,vNodes);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkNodeSupport( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Abc_ObjIsCo(ppNodes[i]) )
            Abc_NtkNodeSupport_rec( Abc_ObjFanin0(ppNodes[i]), vNodes );
        else
            Abc_NtkNodeSupport_rec( ppNodes[i], vNodes );
    return vNodes;
}